

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_CLASS::Save
          (_Type_CLASS *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Object *pOVar1;
  uint uVar2;
  int v;
  size_type sVar3;
  const_reference this_00;
  Object *pOVar4;
  char *pcVar5;
  ostream *poVar6;
  array<LiteScript::Nullable<LiteScript::Variable>,_33UL> *this_01;
  const_reference pvVar7;
  Variable *this_02;
  long *plVar8;
  offset_in_Memory_to_subr in_R8;
  Class *local_188;
  Class *local_148;
  Class *local_100;
  Class *local_c8;
  uint local_a4;
  uint i_3;
  array<LiteScript::Nullable<LiteScript::Variable>,_33UL> *op_list;
  uint local_84;
  uint local_80;
  uint sz_2;
  uint i_2;
  undefined1 local_70 [24];
  uint sz_1;
  uint i_1;
  uint sz;
  uint i;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *inherits;
  Class *C;
  offset_in_Memory_to_subr caller_local;
  pointer local_30;
  Object *object_local;
  ostream *stream_local;
  _Type_CLASS *this_local;
  
  C = (Class *)caller;
  caller_local = in_R8;
  local_30 = (pointer)object;
  object_local = (Object *)stream;
  stream_local = (ostream *)this;
  this_local = (_Type_CLASS *)caller;
  inherits = &Object::GetData<LiteScript::Class>(object)->inherit;
  _sz = (pointer)Class::GetInherits((Class *)inherits);
  pOVar1 = object_local;
  sVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)_sz);
  OStreamer::Write<unsigned_int>((ostream *)pOVar1,(uint)sVar3);
  i_1 = 0;
  sVar3 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)_sz);
  sz_1 = (uint)sVar3;
  for (; pOVar1 = object_local, i_1 < sz_1; i_1 = i_1 + 1) {
    plVar8 = (long *)((long)(((Memory *)(local_30->second).obj)->arr)._M_elems + caller_local);
    if (((ulong)C & 1) == 0) {
      local_c8 = C;
    }
    else {
      local_c8 = *(Class **)((C->op_members)._M_elems[0].data + *plVar8 + -0x49);
    }
    this_00 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator[]
                        ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)_sz,
                         (ulong)i_1);
    pOVar4 = Variable::operator->(this_00);
    (*(code *)local_c8)(plVar8,pOVar1,pOVar4->ID);
  }
  uVar2 = Class::GetStaticCount((Class *)inherits);
  OStreamer::Write<unsigned_int>((ostream *)pOVar1,uVar2);
  local_70._20_4_ = 0;
  local_70._16_4_ = Class::GetStaticCount((Class *)inherits);
  for (; pOVar1 = object_local, (uint)local_70._20_4_ < (uint)local_70._16_4_;
      local_70._20_4_ = local_70._20_4_ + 1) {
    pcVar5 = Class::GetStaticName((Class *)inherits,local_70._20_4_);
    poVar6 = std::operator<<((ostream *)pOVar1,pcVar5);
    std::operator<<(poVar6,'\0');
    pOVar1 = object_local;
    plVar8 = (long *)((long)(((Memory *)(local_30->second).obj)->arr)._M_elems + caller_local);
    if (((ulong)C & 1) == 0) {
      local_100 = C;
    }
    else {
      local_100 = *(Class **)((C->op_members)._M_elems[0].data + *plVar8 + -0x49);
    }
    Class::GetStaticMember((Class *)local_70,(uint)inherits);
    pOVar4 = Variable::operator->((Variable *)local_70);
    (*(code *)local_100)(plVar8,pOVar1,pOVar4->ID);
    Variable::~Variable((Variable *)local_70);
  }
  uVar2 = Class::GetUnstaticCount((Class *)inherits);
  OStreamer::Write<unsigned_int>((ostream *)pOVar1,uVar2);
  local_80 = 0;
  local_84 = Class::GetUnstaticCount((Class *)inherits);
  for (; pOVar1 = object_local, local_80 < local_84; local_80 = local_80 + 1) {
    pcVar5 = Class::GetUnstaticName((Class *)inherits,local_80);
    poVar6 = std::operator<<((ostream *)pOVar1,pcVar5);
    std::operator<<(poVar6,'\0');
    pOVar1 = object_local;
    plVar8 = (long *)((long)(((Memory *)(local_30->second).obj)->arr)._M_elems + caller_local);
    if (((ulong)C & 1) == 0) {
      local_148 = C;
    }
    else {
      local_148 = *(Class **)((C->op_members)._M_elems[0].data + *plVar8 + -0x49);
    }
    Class::GetUnstaticMember((Class *)&op_list,(uint)inherits);
    pOVar4 = Variable::operator->((Variable *)&op_list);
    (*(code *)local_148)(plVar8,pOVar1,pOVar4->ID);
    Variable::~Variable((Variable *)&op_list);
  }
  v = Class::GetConstructorIndex((Class *)inherits);
  OStreamer::Write<int>((ostream *)pOVar1,v);
  this_01 = Class::GetOperators((Class *)inherits);
  for (local_a4 = 0; local_a4 < 0x21; local_a4 = local_a4 + 1) {
    pvVar7 = std::array<LiteScript::Nullable<LiteScript::Variable>,_33UL>::operator[]
                       (this_01,(ulong)local_a4);
    if ((*pvVar7->isNull & 1U) == 0) {
      std::operator<<((ostream *)object_local,'\x01');
      pOVar1 = object_local;
      plVar8 = (long *)((long)(((Memory *)(local_30->second).obj)->arr)._M_elems + caller_local);
      if (((ulong)C & 1) == 0) {
        local_188 = C;
      }
      else {
        local_188 = *(Class **)((C->op_members)._M_elems[0].data + *plVar8 + -0x49);
      }
      pvVar7 = std::array<LiteScript::Nullable<LiteScript::Variable>,_33UL>::operator[]
                         (this_01,(ulong)local_a4);
      this_02 = Nullable<LiteScript::Variable>::operator*(pvVar7);
      pOVar4 = Variable::operator->(this_02);
      (*(code *)local_188)(plVar8,pOVar1,pOVar4->ID);
    }
    else {
      std::operator<<((ostream *)object_local,'\0');
    }
  }
  return;
}

Assistant:

void LiteScript::_Type_CLASS::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Class& C = object.GetData<Class>();
    const std::vector<LiteScript::Variable>& inherits = C.GetInherits();
    OStreamer::Write<unsigned int>(stream, inherits.size());
    for (unsigned int i = 0, sz = inherits.size(); i < sz; i++)
        (object.memory.*caller)(stream, inherits[i]->ID);
    OStreamer::Write<unsigned int>(stream, C.GetStaticCount());
    for (unsigned int i = 0, sz = C.GetStaticCount(); i < sz; i++) {
        stream << C.GetStaticName(i) << (uint8_t)0;
        (object.memory.*caller)(stream, C.GetStaticMember(i)->ID);
    }
    OStreamer::Write<unsigned int>(stream, C.GetUnstaticCount());
    for (unsigned int i = 0, sz = C.GetUnstaticCount(); i < sz; i++) {
        stream << C.GetUnstaticName(i) << (uint8_t)0;
        (object.memory.*caller)(stream, C.GetUnstaticMember(i)->ID);
    }
    OStreamer::Write<int>(stream, C.GetConstructorIndex());
    const std::array<Nullable<Variable>, Class::OperatorType::OP_TYPE_NUMBER>& op_list = C.GetOperators();
    for (unsigned int i = 0; i < Class::OperatorType::OP_TYPE_NUMBER; i++) {
        if (op_list[i].isNull)
            stream << (uint8_t)0;
        else {
            stream << (uint8_t)1;
            (object.memory.*caller)(stream, (*op_list[i])->ID);
        }
    }
}